

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_vox.cpp
# Opt level: O2

bool demo_load_and_save(char *filename)

{
  ogt_vox_group *poVar1;
  ogt_vox_instance *poVar2;
  ogt_vox_scene *scene;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  uint32_t instance_index;
  uint32_t layer_index;
  ulong uVar9;
  
  scene = load_vox_scene_with_groups(filename);
  if (scene == (ogt_vox_scene *)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
  }
  else {
    printf("#layers: %u\n",(ulong)scene->num_layers);
    lVar7 = 0;
    for (uVar9 = 0; uVar9 < scene->num_layers; uVar9 = uVar9 + 1) {
      pcVar5 = *(char **)((long)&scene->layers->name + lVar7);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      pcVar3 = "shown";
      if ((&scene->layers->hidden)[lVar7] != false) {
        pcVar3 = "hidden";
      }
      printf("layer[%u,name=%s] is %s\n",uVar9 & 0xffffffff,pcVar5,pcVar3);
      lVar7 = lVar7 + 0x10;
    }
    printf("#groups: %u\n",(ulong)scene->num_groups);
    lVar7 = 0x48;
    for (uVar9 = 0; uVar9 < scene->num_groups; uVar9 = uVar9 + 1) {
      poVar1 = scene->groups;
      uVar4 = (ulong)*(uint *)((long)&poVar1->name + lVar7 + 4);
      if (uVar4 == 0xffffffff) {
        uVar6 = (ulong)*(uint *)((long)&poVar1->name + lVar7);
LAB_00108722:
        pcVar5 = "";
      }
      else {
        uVar6 = (ulong)*(uint *)((long)&poVar1->name + lVar7);
        if (scene->layers == (ogt_vox_layer *)0x0) goto LAB_00108722;
        pcVar3 = scene->layers[uVar4].name;
        pcVar5 = "";
        if (pcVar3 != (char *)0x0) {
          pcVar5 = pcVar3;
        }
      }
      pcVar3 = "hidden";
      if (*(char *)((long)&(poVar1->transform).m00 + lVar7) == '\0') {
        pcVar3 = "shown";
      }
      printf("group[%u] has parent group %u, is part of layer[%u,name=%s] and is %s\n",
             uVar9 & 0xffffffff,uVar6,uVar4,pcVar5,pcVar3);
      lVar7 = lVar7 + 0x68;
    }
    printf("# instances: %u\n",(ulong)scene->num_instances);
    lVar7 = 0x54;
    for (uVar9 = 0; uVar9 < scene->num_instances; uVar9 = uVar9 + 1) {
      poVar2 = scene->instances;
      uVar4 = (ulong)*(uint *)((long)poVar2 + lVar7 + -8);
      pcVar5 = "(no layer)";
      if (uVar4 != 0xffffffff) {
        pcVar3 = scene->layers[uVar4].name;
        pcVar5 = "";
        if (pcVar3 != (char *)0x0) {
          pcVar5 = pcVar3;
        }
      }
      pcVar3 = *(char **)((long)poVar2 + lVar7 + -0x54);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = "";
      }
      pcVar8 = "hidden";
      if (*(char *)((long)&poVar2->name + lVar7) == '\0') {
        pcVar8 = "shown";
      }
      printf("instance[%u,name=%s] at position (%.0f,%.0f,%.0f) uses model %u and is in layer[%u, name=\'%s\'], group %u, and is %s\n"
             ,(double)*(float *)((long)poVar2 + lVar7 + -0x1c),
             (double)*(float *)((long)poVar2 + lVar7 + -0x18),
             (double)*(float *)((long)poVar2 + lVar7 + -0x14),uVar9 & 0xffffffff,pcVar3,
             (ulong)*(uint *)((long)poVar2 + lVar7 + -0xc),uVar4,pcVar5,
             (ulong)*(uint *)((long)poVar2 + lVar7 + -4),pcVar8);
      lVar7 = lVar7 + 0x78;
    }
    printf("# models: %u\n",(ulong)scene->num_models);
    for (uVar9 = 0; uVar9 < scene->num_models; uVar9 = uVar9 + 1) {
      count_solid_voxels_in_model(scene->models[uVar9]);
      printf(" model[%u] has dimension %ux%ux%u, with %u solid voxels of the total %u voxels (hash=%u)!\n"
             ,uVar9 & 0xffffffff);
    }
    save_vox_scene("saved.vox",scene);
    ogt_vox_destroy_scene(scene);
  }
  return scene != (ogt_vox_scene *)0x0;
}

Assistant:

bool demo_load_and_save(const char *filename)
{
    const ogt_vox_scene* scene = load_vox_scene_with_groups(filename);
    if (scene)
    {
        printf("#layers: %u\n", scene->num_layers);
        for (uint32_t layer_index = 0; layer_index < scene->num_layers; layer_index++)
        {
            const ogt_vox_layer* layer = &scene->layers[layer_index];
            printf("layer[%u,name=%s] is %s\n",
                layer_index,
                layer->name ? layer->name : "",
                layer->hidden ? "hidden" : "shown");
        }
        printf("#groups: %u\n", scene->num_groups);
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++)
        {
            const ogt_vox_group* group = &scene->groups[group_index];
            const ogt_vox_layer* group_layer = group->layer_index != UINT32_MAX ? &scene->layers[group->layer_index] : NULL;
            printf("group[%u] has parent group %u, is part of layer[%u,name=%s] and is %s\n", 
                group_index, 
                group->parent_group_index,
                group->layer_index,
                group_layer && group_layer->name ? group_layer->name : "",
                group->hidden ? "hidden" : "shown");
        }
            
        // iterate over all instances - and print basic information about the instance and the model that it references
        printf("# instances: %u\n", scene->num_instances);
        for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++)
        {
            const ogt_vox_instance* instance = &scene->instances[instance_index];
            const ogt_vox_model* model = scene->models[instance->model_index];
            
            const char* layer_name =
                instance->layer_index == UINT32_MAX ? "(no layer)":
                scene->layers[instance->layer_index].name ? scene->layers[instance->layer_index].name : 
                "";

            printf("instance[%u,name=%s] at position (%.0f,%.0f,%.0f) uses model %u and is in layer[%u, name='%s'], group %u, and is %s\n",
                instance_index,
                instance->name ? instance->name : "",
                instance->transform.m30, instance->transform.m31, instance->transform.m32, // translation components of the instance
                instance->model_index,
                instance->layer_index,
                layer_name,
                instance->group_index,
                instance->hidden ? "hidden" : "shown");
        }
        // iterate over all models and print basic information about the model.
        printf("# models: %u\n", scene->num_models);
        for (uint32_t model_index = 0; model_index < scene->num_models; model_index++)
        {
            const ogt_vox_model* model = scene->models[model_index];

            uint32_t solid_voxel_count = count_solid_voxels_in_model(model);
            uint32_t total_voxel_count = model->size_x * model->size_y * model->size_z;

            printf(" model[%u] has dimension %ux%ux%u, with %u solid voxels of the total %u voxels (hash=%u)!\n",
                model_index,
                model->size_x, model->size_y, model->size_z,
                solid_voxel_count,
                total_voxel_count,
                model->voxel_hash);
        }

        save_vox_scene("saved.vox", scene); 

        ogt_vox_destroy_scene(scene);
        return true;
    }
    fprintf(stderr, "Failed to load %s\n", filename);
    return false;
}